

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_v7tar.c
# Opt level: O2

int archive_write_v7tar_header(archive_write *a,archive_entry *entry)

{
  size_t sVar1;
  char cVar2;
  mode_t mVar3;
  wchar_t wVar4;
  int iVar5;
  archive_string_conv *sc;
  char *pcVar6;
  size_t sVar7;
  archive_string *paVar8;
  int *piVar9;
  char *pcVar10;
  int64_t iVar11;
  time_t v;
  long lVar12;
  uint uVar13;
  int iVar14;
  char cVar15;
  int64_t *piVar16;
  size_t copy_length;
  int64_t *local_250;
  char *p;
  char *local_240;
  char buff [512];
  
  piVar16 = (int64_t *)a->format_data;
  sc = (archive_string_conv *)piVar16[2];
  if (sc == (archive_string_conv *)0x0) {
    if ((int)piVar16[4] == 0) {
      sc = archive_string_default_conversion_for_write(&a->archive);
      piVar16[3] = (int64_t)sc;
      *(undefined4 *)(piVar16 + 4) = 1;
    }
    else {
      sc = (archive_string_conv *)piVar16[3];
    }
  }
  pcVar6 = archive_entry_pathname(entry);
  if (pcVar6 == (char *)0x0) {
    pcVar6 = "Can\'t record entry in tar file without pathname";
    iVar14 = -1;
    goto LAB_004b3c38;
  }
  pcVar6 = archive_entry_hardlink(entry);
  if (((pcVar6 != (char *)0x0) || (pcVar6 = archive_entry_symlink(entry), pcVar6 != (char *)0x0)) ||
     (mVar3 = archive_entry_filetype(entry), mVar3 != 0x8000)) {
    archive_entry_set_size(entry,0);
  }
  mVar3 = archive_entry_filetype(entry);
  if (((mVar3 == 0x4000) && (pcVar6 = archive_entry_pathname(entry), pcVar6 != (char *)0x0)) &&
     (sVar7 = strlen(pcVar6), pcVar6[sVar7 - 1] != '/')) {
    buff[0] = '\0';
    buff[1] = '\0';
    buff[2] = '\0';
    buff[3] = '\0';
    buff[4] = '\0';
    buff[5] = '\0';
    buff[6] = '\0';
    buff[7] = '\0';
    buff[8] = '\0';
    buff[9] = '\0';
    buff[10] = '\0';
    buff[0xb] = '\0';
    buff[0xc] = '\0';
    buff[0xd] = '\0';
    buff[0xe] = '\0';
    buff[0xf] = '\0';
    buff[0x10] = '\0';
    buff[0x11] = '\0';
    buff[0x12] = '\0';
    buff[0x13] = '\0';
    buff[0x14] = '\0';
    buff[0x15] = '\0';
    buff[0x16] = '\0';
    buff[0x17] = '\0';
    local_250 = piVar16;
    sVar7 = strlen(pcVar6);
    paVar8 = archive_string_ensure((archive_string *)buff,sVar7 + 2);
    if (paVar8 == (archive_string *)0x0) {
      archive_set_error(&a->archive,0xc,"Can\'t allocate v7tar data");
      archive_string_free((archive_string *)buff);
      return -0x1e;
    }
    buff[8] = '\0';
    buff[9] = '\0';
    buff[10] = '\0';
    buff[0xb] = '\0';
    buff[0xc] = '\0';
    buff[0xd] = '\0';
    buff[0xe] = '\0';
    buff[0xf] = '\0';
    archive_strncat((archive_string *)buff,pcVar6,sVar7);
    archive_strappend_char((archive_string *)buff,'/');
    archive_entry_copy_pathname(entry,(char *)buff._0_8_);
    archive_string_free((archive_string *)buff);
    piVar16 = local_250;
  }
  memcpy(buff,"",0x200);
  wVar4 = _archive_entry_pathname_l(entry,&local_240,&copy_length,sc);
  if (wVar4 == L'\0') {
    iVar14 = 0;
    local_250 = piVar16;
  }
  else {
    piVar9 = __errno_location();
    pcVar6 = local_240;
    if (*piVar9 == 0xc) {
      pcVar6 = "Can\'t allocate memory for Pathname";
      goto LAB_004b3d3b;
    }
    iVar14 = -0x14;
    local_250 = piVar16;
    pcVar10 = archive_string_conversion_charset_name(sc);
    archive_set_error(&a->archive,0x54,"Can\'t translate pathname \'%s\' to %s",pcVar6,pcVar10);
  }
  if (copy_length < 100) {
    memcpy(buff,local_240,copy_length);
  }
  else {
    iVar14 = -0x19;
    archive_set_error(&a->archive,0x24,"Pathname too long");
  }
  wVar4 = _archive_entry_hardlink_l(entry,&p,&copy_length,sc);
  if (wVar4 != L'\0') {
    piVar9 = __errno_location();
    pcVar6 = p;
    if (*piVar9 != 0xc) {
      pcVar10 = archive_string_conversion_charset_name(sc);
      archive_set_error(&a->archive,0x54,"Can\'t translate linkname \'%s\' to %s",pcVar6,pcVar10);
      iVar14 = -0x14;
      goto LAB_004b3cff;
    }
LAB_004b3d34:
    pcVar6 = "Can\'t allocate memory for Linkname";
LAB_004b3d3b:
    archive_set_error(&a->archive,0xc,pcVar6);
    return -0x1e;
  }
LAB_004b3cff:
  sVar1 = copy_length;
  cVar2 = '1';
  if (copy_length == 0) {
    wVar4 = _archive_entry_symlink_l(entry,&p,&copy_length,sc);
    if (wVar4 != L'\0') {
      piVar9 = __errno_location();
      pcVar6 = p;
      if (*piVar9 == 0xc) goto LAB_004b3d34;
      pcVar10 = archive_string_conversion_charset_name(sc);
      archive_set_error(&a->archive,0x54,"Can\'t translate linkname \'%s\' to %s",pcVar6,pcVar10);
      iVar14 = -0x14;
    }
    cVar15 = -1;
    cVar2 = -1;
    if (copy_length != 0) goto LAB_004b3db5;
  }
  else {
LAB_004b3db5:
    cVar15 = cVar2;
    if (99 < copy_length) {
      archive_set_error(&a->archive,0x24,"Link contents too long");
      copy_length = 100;
      iVar14 = -0x19;
    }
    memcpy(buff + 0x9d,p,copy_length);
  }
  mVar3 = archive_entry_mode(entry);
  iVar5 = format_octal((ulong)(mVar3 & 0xfff),buff + 100,6);
  if (iVar5 != 0) {
    archive_set_error(&a->archive,0x22,"Numeric mode too large");
    iVar14 = -0x19;
  }
  iVar11 = archive_entry_uid(entry);
  iVar5 = format_octal(iVar11,buff + 0x6c,6);
  if (iVar5 != 0) {
    archive_set_error(&a->archive,0x22,"Numeric user ID too large");
    iVar14 = -0x19;
  }
  iVar11 = archive_entry_gid(entry);
  iVar5 = format_octal(iVar11,buff + 0x74,6);
  if (iVar5 != 0) {
    archive_set_error(&a->archive,0x22,"Numeric group ID too large");
    iVar14 = -0x19;
  }
  iVar11 = archive_entry_size(entry);
  iVar5 = format_octal(iVar11,buff + 0x7c,0xb);
  if (iVar5 != 0) {
    archive_set_error(&a->archive,0x22,"File size out of range");
    iVar14 = -0x19;
  }
  v = archive_entry_mtime(entry);
  iVar5 = format_octal(v,buff + 0x88,0xb);
  if (iVar5 != 0) {
    archive_set_error(&a->archive,0x22,"File modification time too large");
    iVar14 = -0x19;
  }
  if (sVar1 != 0) {
    buff[0x9c] = cVar15;
    goto switchD_004b3fb6_caseD_3;
  }
  mVar3 = archive_entry_filetype(entry);
  switch(mVar3 << 0x14 | mVar3 - 0x1000 >> 0xc) {
  case 0:
    pcVar6 = "tar format cannot archive fifo";
    break;
  case 1:
    pcVar6 = "tar format cannot archive character device";
    break;
  default:
    archive_entry_mode(entry);
    archive_set_error(&a->archive,0x54,"tar format cannot archive this (mode=0%lo)");
    iVar14 = -0x19;
  case 3:
  case 7:
switchD_004b3fb6_caseD_3:
    uVar13 = 0;
    for (lVar12 = 0; lVar12 != 0x200; lVar12 = lVar12 + 1) {
      uVar13 = uVar13 + (byte)buff[lVar12];
    }
    format_octal((ulong)uVar13,buff + 0x94,6);
    buff[0x9a] = '\0';
    if (-0x15 < iVar14) {
      iVar5 = __archive_write_output(a,buff,0x200);
      if (-0x15 < iVar5) {
        if (iVar14 <= iVar5) {
          iVar5 = iVar14;
        }
        iVar11 = archive_entry_size(entry);
        *local_250 = iVar11;
        local_250[1] = (ulong)(-(int)iVar11 & 0x1ff);
        return iVar5;
      }
      return iVar5;
    }
    return iVar14;
  case 5:
    pcVar6 = "tar format cannot archive block device";
    break;
  case 9:
    buff[0x9c] = '2';
    goto switchD_004b3fb6_caseD_3;
  case 0xb:
    pcVar6 = "tar format cannot archive socket";
  }
  iVar14 = 0x54;
LAB_004b3c38:
  archive_set_error(&a->archive,iVar14,pcVar6);
  return -0x19;
}

Assistant:

static int
archive_write_v7tar_header(struct archive_write *a, struct archive_entry *entry)
{
	char buff[512];
	int ret, ret2;
	struct v7tar *v7tar;
	struct archive_entry *entry_main;
	struct archive_string_conv *sconv;

	v7tar = (struct v7tar *)a->format_data;

	/* Setup default string conversion. */
	if (v7tar->opt_sconv == NULL) {
		if (!v7tar->init_default_conversion) {
			v7tar->sconv_default =
			    archive_string_default_conversion_for_write(
				&(a->archive));
			v7tar->init_default_conversion = 1;
		}
		sconv = v7tar->sconv_default;
	} else
		sconv = v7tar->opt_sconv;

	/* Sanity check. */
	if (archive_entry_pathname(entry) == NULL) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "Can't record entry in tar file without pathname");
		return (ARCHIVE_FAILED);
	}

	/* Only regular files (not hardlinks) have data. */
	if (archive_entry_hardlink(entry) != NULL ||
	    archive_entry_symlink(entry) != NULL ||
	    !(archive_entry_filetype(entry) == AE_IFREG))
		archive_entry_set_size(entry, 0);

	if (AE_IFDIR == archive_entry_filetype(entry)) {
		const char *p;
		size_t path_length;
		/*
		 * Ensure a trailing '/'.  Modify the entry so
		 * the client sees the change.
		 */
#if defined(_WIN32) && !defined(__CYGWIN__)
		const wchar_t *wp;

		wp = archive_entry_pathname_w(entry);
		if (wp != NULL && wp[wcslen(wp) -1] != L'/') {
			struct archive_wstring ws;

			archive_string_init(&ws);
			path_length = wcslen(wp);
			if (archive_wstring_ensure(&ws,
			    path_length + 2) == NULL) {
				archive_set_error(&a->archive, ENOMEM,
				    "Can't allocate v7tar data");
				archive_wstring_free(&ws);
				return(ARCHIVE_FATAL);
			}
			/* Should we keep '\' ? */
			if (wp[path_length -1] == L'\\')
				path_length--;
			archive_wstrncpy(&ws, wp, path_length);
			archive_wstrappend_wchar(&ws, L'/');
			archive_entry_copy_pathname_w(entry, ws.s);
			archive_wstring_free(&ws);
			p = NULL;
		} else
#endif
			p = archive_entry_pathname(entry);
		/*
		 * On Windows, this is a backup operation just in
		 * case getting WCS failed. On POSIX, this is a
		 * normal operation.
		 */
		if (p != NULL && p[strlen(p) - 1] != '/') {
			struct archive_string as;

			archive_string_init(&as);
			path_length = strlen(p);
			if (archive_string_ensure(&as,
			    path_length + 2) == NULL) {
				archive_set_error(&a->archive, ENOMEM,
				    "Can't allocate v7tar data");
				archive_string_free(&as);
				return(ARCHIVE_FATAL);
			}
#if defined(_WIN32) && !defined(__CYGWIN__)
			/* NOTE: This might break the pathname
			 * if the current code page is CP932 and
			 * the pathname includes a character '\'
			 * as a part of its multibyte pathname. */
			if (p[strlen(p) -1] == '\\')
				path_length--;
			else
#endif
			archive_strncpy(&as, p, path_length);
			archive_strappend_char(&as, '/');
			archive_entry_copy_pathname(entry, as.s);
			archive_string_free(&as);
		}
	}

#if defined(_WIN32) && !defined(__CYGWIN__)
	/* Make sure the path separators in pahtname, hardlink and symlink
	 * are all slash '/', not the Windows path separator '\'. */
	entry_main = __la_win_entry_in_posix_pathseparator(entry);
	if (entry_main == NULL) {
		archive_set_error(&a->archive, ENOMEM,
		    "Can't allocate v7tar data");
		return(ARCHIVE_FATAL);
	}
	if (entry != entry_main)
		entry = entry_main;
	else
		entry_main = NULL;
#else
	entry_main = NULL;
#endif
	ret = format_header_v7tar(a, buff, entry, 1, sconv);
	if (ret < ARCHIVE_WARN) {
		if (entry_main)
			archive_entry_free(entry_main);
		return (ret);
	}
	ret2 = __archive_write_output(a, buff, 512);
	if (ret2 < ARCHIVE_WARN) {
		if (entry_main)
			archive_entry_free(entry_main);
		return (ret2);
	}
	if (ret2 < ret)
		ret = ret2;

	v7tar->entry_bytes_remaining = archive_entry_size(entry);
	v7tar->entry_padding = 0x1ff & (-(int64_t)v7tar->entry_bytes_remaining);
	if (entry_main)
		archive_entry_free(entry_main);
	return (ret);
}